

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

json_token * find_json_token(json_token *toks,char *path)

{
  int iVar1;
  bool bVar2;
  int local_34;
  int local_30;
  int n;
  int skip;
  int ind;
  int ind2;
  int i;
  char *path_local;
  json_token *toks_local;
  
  _ind2 = path;
  path_local = (char *)toks;
  do {
    bVar2 = false;
    if (_ind2 != (char *)0x0) {
      bVar2 = *_ind2 != '\0';
    }
    if (!bVar2) {
      return (json_token *)0x0;
    }
    skip = 0;
    n = -1;
    local_30 = 2;
    local_34 = path_part_len(_ind2);
    if (*_ind2 == '[') {
      if ((*(int *)(path_local + 0x10) != 7) || (iVar1 = is_digit((int)_ind2[1]), iVar1 == 0)) {
        return (json_token *)0x0;
      }
      n = 0;
      local_34 = 1;
      while( true ) {
        bVar2 = false;
        if (_ind2[local_34] != ']') {
          bVar2 = _ind2[local_34] != '\0';
        }
        if (!bVar2) break;
        iVar1 = is_digit((int)_ind2[local_34]);
        if (iVar1 == 0) {
          return (json_token *)0x0;
        }
        n = _ind2[local_34] + -0x30 + n * 10;
        local_34 = local_34 + 1;
      }
      if (_ind2[local_34] != ']') {
        return (json_token *)0x0;
      }
      local_30 = 1;
      local_34 = local_34 + 1;
    }
    else if (*(int *)(path_local + 0x10) != 3) {
      return (json_token *)0x0;
    }
    for (ind = 0; ind < *(int *)(path_local + 0xc); ind = local_30 + ind) {
      if ((n == -1) && (*(int *)(path_local + (long)ind * 0x18 + 0x28) != 1)) {
        return (json_token *)0x0;
      }
      if ((skip == n) ||
         (((n == -1 && (*(int *)(path_local + (long)ind * 0x18 + 0x20) == local_34)) &&
          (iVar1 = compare(_ind2,*(char **)(path_local + (long)ind * 0x18 + 0x18),local_34),
          iVar1 != 0)))) {
        ind = local_30 + -1 + ind;
        break;
      }
      if ((*(int *)(path_local + (long)(ind + -1 + local_30) * 0x18 + 0x28) == 7) ||
         (*(int *)(path_local + (long)(ind + -1 + local_30) * 0x18 + 0x28) == 3)) {
        ind = *(int *)(path_local + (long)(ind + -1 + local_30) * 0x18 + 0x24) + ind;
      }
      skip = skip + 1;
    }
    if (ind == *(int *)(path_local + 0xc)) {
      return (json_token *)0x0;
    }
    _ind2 = _ind2 + local_34;
    if (*_ind2 == '.') {
      _ind2 = _ind2 + 1;
    }
    if (*_ind2 == '\0') {
      return (json_token *)(path_local + (long)ind * 0x18 + 0x18);
    }
    path_local = path_local + (long)ind * 0x18 + 0x18;
  } while( true );
}

Assistant:

struct json_token *find_json_token(struct json_token *toks, const char *path) {
    while (path != 0 && path[0] != '\0') {
        int i, ind2 = 0, ind = -1, skip = 2, n = path_part_len(path);
        if (path[0] == '[') {
            if (toks->type != JSON_TYPE_ARRAY || !is_digit(path[1])) return 0;
            for (ind = 0, n = 1; path[n] != ']' && path[n] != '\0'; n++) {
                if (!is_digit(path[n])) return 0;
                ind *= 10;
                ind += path[n] - '0';
            }
            if (path[n++] != ']') return 0;
            skip = 1;  /* In objects, we skip 2 elems while iterating, in arrays 1. */
        } else if (toks->type != JSON_TYPE_OBJECT) return 0;
        toks++;
        for (i = 0; i < toks[-1].num_desc; i += skip, ind2++) {
            /* ind == -1 indicated that we're iterating an array, not object */
            if (ind == -1 && toks[i].type != JSON_TYPE_STRING) return 0;
            if (ind2 == ind ||
                (ind == -1 && toks[i].len == n && compare(path, toks[i].ptr, n))) {
                i += skip - 1;
                break;
            };
            if (toks[i - 1 + skip].type == JSON_TYPE_ARRAY ||
                toks[i - 1 + skip].type == JSON_TYPE_OBJECT) {
                i += toks[i - 1 + skip].num_desc;
            }
        }
        if (i == toks[-1].num_desc) return 0;
        path += n;
        if (path[0] == '.') path++;
        if (path[0] == '\0') return &toks[i];
        toks += i;
    }
    return 0;
}